

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension.h
# Opt level: O0

char absl::lts_20250127::str_format_internal::FormatConversionCharToChar(FormatConversionChar c)

{
  undefined1 local_9;
  FormatConversionChar c_local;
  
  if (c == 0x13) {
    local_9 = '\0';
  }
  else if (c == 0) {
    local_9 = 'c';
  }
  else if (c == 1) {
    local_9 = 's';
  }
  else if (c == 2) {
    local_9 = 'd';
  }
  else if (c == 3) {
    local_9 = 'i';
  }
  else if (c == 4) {
    local_9 = 'o';
  }
  else if (c == 5) {
    local_9 = 'u';
  }
  else if (c == 6) {
    local_9 = 'x';
  }
  else if (c == 7) {
    local_9 = 'X';
  }
  else if (c == 8) {
    local_9 = 'f';
  }
  else if (c == 9) {
    local_9 = 'F';
  }
  else if (c == 10) {
    local_9 = 'e';
  }
  else if (c == 0xb) {
    local_9 = 'E';
  }
  else if (c == 0xc) {
    local_9 = 'g';
  }
  else if (c == 0xd) {
    local_9 = 'G';
  }
  else if (c == 0xe) {
    local_9 = 'a';
  }
  else if (c == 0xf) {
    local_9 = 'A';
  }
  else if (c == 0x10) {
    local_9 = 'n';
  }
  else if (c == 0x11) {
    local_9 = 'p';
  }
  else if (c == 0x12) {
    local_9 = 'v';
  }
  else {
    local_9 = '\0';
  }
  return local_9;
}

Assistant:

inline char FormatConversionCharToChar(FormatConversionChar c) {
  if (c == FormatConversionCharInternal::kNone) {
    return '\0';

#define ABSL_INTERNAL_X_VAL(e)                       \
  } else if (c == FormatConversionCharInternal::e) { \
    return #e[0];
#define ABSL_INTERNAL_X_SEP
  ABSL_INTERNAL_CONVERSION_CHARS_EXPAND_(ABSL_INTERNAL_X_VAL,
                                         ABSL_INTERNAL_X_SEP)
  } else {
    return '\0';
  }

#undef ABSL_INTERNAL_X_VAL
#undef ABSL_INTERNAL_X_SEP
}